

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O0

void __thiscall iDynTree::Direction::Direction(Direction *this,double *in_data,uint in_size)

{
  undefined4 in_EDX;
  VectorFixSize<3U> *in_RSI;
  double in_RDI;
  Direction *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  VectorFixSize<3U>::VectorFixSize
            (in_RSI,(double *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(size_t)in_RDI);
  Normalize(unaff_retaddr,in_RDI);
  return;
}

Assistant:

Direction::Direction(const double* in_data, const unsigned int in_size):
                 VectorFixSize< 3 >(in_data,in_size)
    {
        this->Normalize();
    }